

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_primitive.cc
# Opt level: O1

string * __thiscall
PPConstDef::ToCode_abi_cxx11_(string *__return_storage_ptr__,PPConstDef *this,Env *env)

{
  long *plVar1;
  Type *data_type;
  char *pcVar2;
  char *pcVar3;
  string type_str;
  long *local_48 [2];
  long local_38 [2];
  
  data_type = Expr::DataType(this->expr_,env);
  Env::AddID(env,this->id_,TEMP_VAR,data_type);
  Env::SetEvaluated(env,this->id_,true);
  (*(data_type->super_DataDepElement)._vptr_DataDepElement[0xb])(local_48,data_type);
  plVar1 = local_48[0];
  pcVar2 = Env::LValue(env,this->id_);
  pcVar3 = Expr::EvalExpr(this->expr_,(Output *)0x0,env);
  strfmt_abi_cxx11_(__return_storage_ptr__,"%s %s = %s",plVar1,pcVar2,pcVar3);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string PPConstDef::ToCode(Env* env)
	{
	Type* type = expr_->DataType(env);
	env->AddID(id_, TEMP_VAR, type);
	env->SetEvaluated(id_);

	string type_str = type->DataTypeStr();
	return strfmt("%s %s = %s", type_str.c_str(), env->LValue(id_), expr_->EvalExpr(nullptr, env));
	}